

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

bool Kernel::TermList::equals(TermList t1,TermList t2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Term *this;
  Term *this_00;
  TermList *pTVar4;
  Term *t;
  Term *s;
  TermList *tt;
  TermList *ss;
  TermList *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffb8;
  Stack<Kernel::TermList_*> *in_stack_ffffffffffffffc0;
  TermList *local_38;
  TermList *local_30;
  TermList local_18;
  TermList local_10 [2];
  
  if ((equals(Kernel::TermList,Kernel::TermList)::stack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&equals(Kernel::TermList,Kernel::TermList)::stack), iVar2 != 0)) {
    Lib::Stack<Kernel::TermList_*>::Stack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,&equals::stack,&__dso_handle);
    __cxa_guard_release(&equals(Kernel::TermList,Kernel::TermList)::stack);
  }
  local_30 = local_10;
  local_38 = &local_18;
  do {
    bVar1 = isTerm((TermList *)0x98204f);
    if ((bVar1) && (bVar1 = isTerm((TermList *)0x982062), bVar1)) {
      term((TermList *)0x982075);
      bVar1 = Term::shared((Term *)0x98207d);
      if (bVar1) {
        term((TermList *)0x98208d);
        bVar1 = Term::shared((Term *)0x982095);
        if (bVar1) goto LAB_00982146;
      }
      this = term((TermList *)0x9820a7);
      this_00 = term((TermList *)0x9820b6);
      in_stack_ffffffffffffffb4 = Term::functor(this);
      uVar3 = Term::functor(this_00);
      if (in_stack_ffffffffffffffb4 != uVar3) {
        Lib::Stack<Kernel::TermList_*>::reset(&equals::stack);
        return false;
      }
      Term::args(this);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      Term::args(this_00);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
    else {
LAB_00982146:
      in_stack_ffffffffffffffa8 = (TermList *)content(local_30);
      pTVar4 = (TermList *)content(local_38);
      if (in_stack_ffffffffffffffa8 != pTVar4) {
        Lib::Stack<Kernel::TermList_*>::reset(&equals::stack);
        return false;
      }
    }
    bVar1 = Lib::Stack<Kernel::TermList_*>::isEmpty(&equals::stack);
    if (bVar1) {
      return true;
    }
    local_38 = Lib::Stack<Kernel::TermList_*>::pop(&equals::stack);
    local_30 = Lib::Stack<Kernel::TermList_*>::pop(&equals::stack);
    next(local_38);
    bVar1 = isEmpty((TermList *)0x9821ca);
    if (!bVar1) {
      next(local_30);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      next(local_38);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  } while( true );
}

Assistant:

bool TermList::equals(TermList t1, TermList t2)
{
  static Stack<TermList*> stack(8);
  ASS(stack.isEmpty());

  TermList* ss=&t1;
  TermList* tt=&t2;
  for(;;) {
    if (ss->isTerm() && tt->isTerm() && (!ss->term()->shared() || !tt->term()->shared())) {
      Term* s=ss->term();
      Term* t=tt->term();
      if (s->functor()!=t->functor()) {
        stack.reset();
        return false;
      }
      stack.push(s->args());
      stack.push(t->args());
    }
    else if (ss->content()!=tt->content()) {
      stack.reset();
      return false;
    }

    if (stack.isEmpty()) {
      break;
    }
    tt=stack.pop();
    ss=stack.pop();
    if (!tt->next()->isEmpty()) {
      stack.push(ss->next());
      stack.push(tt->next());
    }
  }
  return true;
}